

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cf-socket.c
# Opt level: O0

CURLcode Curl_conn_tcp_accepted_set
                   (Curl_easy *data,connectdata *conn,int sockindex,curl_socket_t *s)

{
  Curl_cfilter *cf_00;
  void *pvVar1;
  curltime cVar2;
  undefined4 uStack_44;
  cf_socket_ctx *ctx;
  Curl_cfilter *cf;
  curl_socket_t *s_local;
  int sockindex_local;
  connectdata *conn_local;
  Curl_easy *data_local;
  
  cf_00 = conn->cfilter[sockindex];
  if ((cf_00 == (Curl_cfilter *)0x0) || (cf_00->cft != &Curl_cft_tcp_accept)) {
    data_local._4_4_ = CURLE_FAILED_INIT;
  }
  else {
    pvVar1 = cf_00->ctx;
    socket_close(data,conn,1,*(curl_socket_t *)((long)pvVar1 + 0x98));
    *(curl_socket_t *)((long)pvVar1 + 0x98) = *s;
    conn->sock[sockindex] = *(curl_socket_t *)((long)pvVar1 + 0x98);
    set_accepted_remote_ip(cf_00,data);
    set_local_ip(cf_00,data);
    *(byte *)((long)pvVar1 + 0x17c) = *(byte *)((long)pvVar1 + 0x17c) & 0xf7 | 8;
    *(byte *)((long)pvVar1 + 0x17c) = *(byte *)((long)pvVar1 + 0x17c) & 0xfd | 2;
    cVar2 = Curl_now();
    *(time_t *)((long)pvVar1 + 0x158) = cVar2.tv_sec;
    *(ulong *)((long)pvVar1 + 0x160) = CONCAT44(uStack_44,cVar2.tv_usec);
    cf_00->field_0x24 = cf_00->field_0x24 & 0xfe | 1;
    if ((data != (Curl_easy *)0x0) &&
       ((((*(ulong *)&(data->set).field_0x8ba >> 0x1c & 1) != 0 && (cf_00 != (Curl_cfilter *)0x0))
        && (0 < cf_00->cft->log_level)))) {
      Curl_trc_cf_infof(data,cf_00,"accepted_set(sock=%d, remote=%s port=%d)",
                        (ulong)*(uint *)((long)pvVar1 + 0x98),(long)pvVar1 + 0xe0,
                        (ulong)*(uint *)((long)pvVar1 + 0x110));
    }
    data_local._4_4_ = CURLE_OK;
  }
  return data_local._4_4_;
}

Assistant:

CURLcode Curl_conn_tcp_accepted_set(struct Curl_easy *data,
                                    struct connectdata *conn,
                                    int sockindex, curl_socket_t *s)
{
  struct Curl_cfilter *cf = NULL;
  struct cf_socket_ctx *ctx = NULL;

  cf = conn->cfilter[sockindex];
  if(!cf || cf->cft != &Curl_cft_tcp_accept)
    return CURLE_FAILED_INIT;

  ctx = cf->ctx;
  /* discard the listen socket */
  socket_close(data, conn, TRUE, ctx->sock);
  ctx->sock = *s;
  conn->sock[sockindex] = ctx->sock;
  set_accepted_remote_ip(cf, data);
  set_local_ip(cf, data);
  ctx->active = TRUE;
  ctx->accepted = TRUE;
  ctx->connected_at = Curl_now();
  cf->connected = TRUE;
  CURL_TRC_CF(data, cf, "accepted_set(sock=%" CURL_FORMAT_SOCKET_T
              ", remote=%s port=%d)",
              ctx->sock, ctx->r_ip, ctx->r_port);

  return CURLE_OK;
}